

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

bool re2::TopEqual(Regexp *a,Regexp *b)

{
  RegexpOp RVar1;
  RegexpOp RVar2;
  ParseFlags PVar3;
  ParseFlags PVar4;
  Rune RVar5;
  Rune RVar6;
  int iVar7;
  int iVar8;
  Rune *__s1;
  Rune *__s2;
  string *psVar9;
  string *psVar10;
  iterator pRVar11;
  iterator pRVar12;
  iterator pRVar13;
  iterator pRVar14;
  ostream *poVar15;
  bool local_225;
  bool local_211;
  bool local_201;
  bool local_1d9;
  bool local_1cd;
  LogMessage local_1b0;
  CharClass *local_30;
  CharClass *bcc;
  CharClass *acc;
  Regexp *b_local;
  Regexp *a_local;
  
  acc = (CharClass *)b;
  b_local = a;
  RVar1 = Regexp::op(a);
  RVar2 = Regexp::op((Regexp *)acc);
  if (RVar1 == RVar2) {
    RVar1 = Regexp::op(b_local);
    switch(RVar1) {
    case kRegexpNoMatch:
    case kRegexpEmptyMatch:
    case kRegexpAnyChar:
    case kRegexpAnyByte:
    case kRegexpBeginLine:
    case kRegexpEndLine:
    case kRegexpWordBoundary:
    case kRegexpNoWordBoundary:
    case kRegexpBeginText:
      a_local._7_1_ = true;
      break;
    case kRegexpLiteral:
      RVar5 = Regexp::rune(b_local);
      RVar6 = Regexp::rune((Regexp *)acc);
      local_1cd = false;
      if (RVar5 == RVar6) {
        PVar3 = Regexp::parse_flags(b_local);
        PVar4 = Regexp::parse_flags((Regexp *)acc);
        PVar3 = operator^(PVar3,PVar4);
        PVar3 = operator&(PVar3,FoldCase);
        local_1cd = PVar3 == NoParseFlags;
      }
      a_local._7_1_ = local_1cd;
      break;
    case kRegexpLiteralString:
      iVar7 = Regexp::nrunes(b_local);
      iVar8 = Regexp::nrunes((Regexp *)acc);
      local_1d9 = false;
      if (iVar7 == iVar8) {
        PVar3 = Regexp::parse_flags(b_local);
        PVar4 = Regexp::parse_flags((Regexp *)acc);
        PVar3 = operator^(PVar3,PVar4);
        PVar3 = operator&(PVar3,FoldCase);
        local_1d9 = false;
        if (PVar3 == NoParseFlags) {
          __s1 = Regexp::runes(b_local);
          __s2 = Regexp::runes((Regexp *)acc);
          iVar7 = Regexp::nrunes(b_local);
          iVar7 = memcmp(__s1,__s2,(long)iVar7 << 2);
          local_1d9 = iVar7 == 0;
        }
      }
      a_local._7_1_ = local_1d9;
      break;
    case kRegexpConcat:
    case kRegexpAlternate:
      iVar7 = Regexp::nsub(b_local);
      iVar8 = Regexp::nsub((Regexp *)acc);
      a_local._7_1_ = iVar7 == iVar8;
      break;
    case kRegexpStar:
    case kRegexpPlus:
    case kRegexpQuest:
      PVar3 = Regexp::parse_flags(b_local);
      PVar4 = Regexp::parse_flags((Regexp *)acc);
      PVar3 = operator^(PVar3,PVar4);
      PVar3 = operator&(PVar3,NonGreedy);
      a_local._7_1_ = PVar3 == NoParseFlags;
      break;
    case kRegexpRepeat:
      PVar3 = Regexp::parse_flags(b_local);
      PVar4 = Regexp::parse_flags((Regexp *)acc);
      PVar3 = operator^(PVar3,PVar4);
      PVar3 = operator&(PVar3,NonGreedy);
      local_201 = false;
      if (PVar3 == NoParseFlags) {
        iVar7 = Regexp::min(b_local);
        iVar8 = Regexp::min((Regexp *)acc);
        local_201 = false;
        if (iVar7 == iVar8) {
          iVar7 = Regexp::max(b_local);
          iVar8 = Regexp::max((Regexp *)acc);
          local_201 = iVar7 == iVar8;
        }
      }
      a_local._7_1_ = local_201;
      break;
    case kRegexpCapture:
      iVar7 = Regexp::cap(b_local);
      iVar8 = Regexp::cap((Regexp *)acc);
      local_211 = false;
      if (iVar7 == iVar8) {
        psVar9 = Regexp::name_abi_cxx11_(b_local);
        psVar10 = Regexp::name_abi_cxx11_((Regexp *)acc);
        local_211 = psVar9 == psVar10;
      }
      a_local._7_1_ = local_211;
      break;
    case kRegexpEndText:
      PVar3 = Regexp::parse_flags(b_local);
      PVar4 = Regexp::parse_flags((Regexp *)acc);
      PVar3 = operator^(PVar3,PVar4);
      PVar3 = operator&(PVar3,WasDollar);
      a_local._7_1_ = PVar3 == NoParseFlags;
      break;
    case kRegexpCharClass:
      bcc = Regexp::cc(b_local);
      local_30 = Regexp::cc((Regexp *)acc);
      iVar7 = CharClass::size(bcc);
      iVar8 = CharClass::size(local_30);
      local_225 = false;
      if (iVar7 == iVar8) {
        pRVar11 = CharClass::end(bcc);
        pRVar12 = CharClass::begin(bcc);
        pRVar13 = CharClass::end(local_30);
        pRVar14 = CharClass::begin(local_30);
        local_225 = false;
        if ((long)pRVar11 - (long)pRVar12 >> 3 == (long)pRVar13 - (long)pRVar14 >> 3) {
          pRVar11 = CharClass::begin(bcc);
          pRVar12 = CharClass::begin(local_30);
          pRVar13 = CharClass::end(bcc);
          pRVar14 = CharClass::begin(bcc);
          iVar7 = memcmp(pRVar11,pRVar12,((long)pRVar13 - (long)pRVar14 >> 3) << 3);
          local_225 = iVar7 == 0;
        }
      }
      a_local._7_1_ = local_225;
      break;
    case kMaxRegexpOp:
      iVar7 = Regexp::match_id(b_local);
      iVar8 = Regexp::match_id((Regexp *)acc);
      a_local._7_1_ = iVar7 == iVar8;
      break;
    default:
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/regexp.cc",
                 0x17e);
      poVar15 = LogMessage::stream(&local_1b0);
      poVar15 = std::operator<<(poVar15,"Unexpected op in Regexp::Equal: ");
      RVar1 = Regexp::op(b_local);
      std::ostream::operator<<(poVar15,RVar1);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
      a_local._7_1_ = false;
    }
  }
  else {
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

static bool TopEqual(Regexp* a, Regexp* b) {
  if (a->op() != b->op())
    return false;

  switch (a->op()) {
    case kRegexpNoMatch:
    case kRegexpEmptyMatch:
    case kRegexpAnyChar:
    case kRegexpAnyByte:
    case kRegexpBeginLine:
    case kRegexpEndLine:
    case kRegexpWordBoundary:
    case kRegexpNoWordBoundary:
    case kRegexpBeginText:
      return true;

    case kRegexpEndText:
      // The parse flags remember whether it's \z or (?-m:$),
      // which matters when testing against PCRE.
      return ((a->parse_flags() ^ b->parse_flags()) & Regexp::WasDollar) == 0;

    case kRegexpLiteral:
      return a->rune() == b->rune() &&
             ((a->parse_flags() ^ b->parse_flags()) & Regexp::FoldCase) == 0;

    case kRegexpLiteralString:
      return a->nrunes() == b->nrunes() &&
             ((a->parse_flags() ^ b->parse_flags()) & Regexp::FoldCase) == 0 &&
             memcmp(a->runes(), b->runes(),
                    a->nrunes() * sizeof a->runes()[0]) == 0;

    case kRegexpAlternate:
    case kRegexpConcat:
      return a->nsub() == b->nsub();

    case kRegexpStar:
    case kRegexpPlus:
    case kRegexpQuest:
      return ((a->parse_flags() ^ b->parse_flags()) & Regexp::NonGreedy) == 0;

    case kRegexpRepeat:
      return ((a->parse_flags() ^ b->parse_flags()) & Regexp::NonGreedy) == 0 &&
             a->min() == b->min() &&
             a->max() == b->max();

    case kRegexpCapture:
      return a->cap() == b->cap() && a->name() == b->name();

    case kRegexpHaveMatch:
      return a->match_id() == b->match_id();

    case kRegexpCharClass: {
      CharClass* acc = a->cc();
      CharClass* bcc = b->cc();
      return acc->size() == bcc->size() &&
             acc->end() - acc->begin() == bcc->end() - bcc->begin() &&
             memcmp(acc->begin(), bcc->begin(),
                    (acc->end() - acc->begin()) * sizeof acc->begin()[0]) == 0;
    }
  }

  LOG(DFATAL) << "Unexpected op in Regexp::Equal: " << a->op();
  return 0;
}